

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.cpp
# Opt level: O3

VkResult __thiscall
myvk::Device::create_device
          (Device *this,
          vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>
          *queue_create_infos,vector<const_char_*,_std::allocator<const_char_*>_> *extensions,
          PhysicalDeviceFeatures *features)

{
  VkResult VVar1;
  VkDeviceCreateInfo local_48;
  
  local_48.enabledLayerCount = 0;
  local_48._36_4_ = 0;
  local_48.ppEnabledLayerNames = (char **)0x0;
  local_48.sType = VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
  local_48._4_4_ = 0;
  local_48.pQueueCreateInfos =
       (queue_create_infos->
       super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>).
       _M_impl.super__Vector_impl_data._M_start;
  local_48._16_8_ =
       (ulong)(uint)((int)((ulong)((long)(queue_create_infos->
                                         super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>
                                         )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_48.pQueueCreateInfos) >> 3) * -0x33333333) << 0x20;
  local_48.ppEnabledExtensionNames =
       (extensions->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_48._48_8_ =
       (ulong)((long)(extensions->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)local_48.ppEnabledExtensionNames) >> 3 & 0xffffffff;
  local_48.pNext = &features->vk11;
  local_48.pEnabledFeatures = &features->vk10;
  VVar1 = (*vkCreateDevice)(((this->m_physical_device_ptr).
                             super___shared_ptr<myvk::PhysicalDevice,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->m_physical_device,&local_48,(VkAllocationCallbacks *)0x0,
                            &this->m_device);
  return VVar1;
}

Assistant:

VkResult Device::create_device(const std::vector<VkDeviceQueueCreateInfo> &queue_create_infos,
                               const std::vector<const char *> &extensions, const PhysicalDeviceFeatures &features) {
	VkDeviceCreateInfo create_info = {};
	create_info.sType = VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
	create_info.pQueueCreateInfos = queue_create_infos.data();
	create_info.queueCreateInfoCount = queue_create_infos.size();
	// features.robustBufferAccess = VK_FALSE; // from ARM/AMD best practice
	create_info.pEnabledFeatures = &features.vk10;
	create_info.enabledExtensionCount = extensions.size();
	create_info.ppEnabledExtensionNames = extensions.data();
	create_info.enabledLayerCount = 0;
	create_info.pNext = &features.vk11;

	return vkCreateDevice(m_physical_device_ptr->GetHandle(), &create_info, nullptr, &m_device);
}